

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void wasm::
     removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
               (vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                *v,unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
                   *m,function<bool_(wasm::Table_*)> *pred)

{
  bool bVar1;
  Table *in_RAX;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> __it;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  __first;
  _Node_iterator<std::pair<const_wasm::Name,_wasm::Table_*>,_false,_true> __tmp;
  Table *local_38;
  
  __it._M_cur = (__node_type *)(m->_M_h)._M_before_begin._M_nxt;
  local_38 = in_RAX;
  if (__it._M_cur != (__node_type *)0x0) {
    do {
      local_38 = *(Table **)((long)__it._M_cur + 0x18);
      if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar1 = (*pred->_M_invoker)((_Any_data *)pred,&local_38);
      if (bVar1) {
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Table_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::erase(&m->_M_h,__it._M_cur);
      }
      else {
        __it._M_cur = *__it._M_cur;
      }
    } while (__it._M_cur != (__node_type *)0x0);
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>,__gnu_cxx::__ops::_Iter_pred<wasm::removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>(std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>&,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>&,std::function<bool(wasm::Table*)>)::_lambda(auto:1&)_1_>>
                      ((v->
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (v->
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_cpp:1813:40)>
                        )pred);
  std::
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ::_M_erase(v,(iterator)__first._M_current,
             (v->
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void removeModuleElements(Vector& v,
                          Map& m,
                          std::function<bool(Elem* elem)> pred) {
  for (auto it = m.begin(); it != m.end();) {
    if (pred(it->second)) {
      it = m.erase(it);
    } else {
      it++;
    }
  }
  v.erase(
    std::remove_if(v.begin(), v.end(), [&](auto& e) { return pred(e.get()); }),
    v.end());
}